

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderAdjacencyTests::configureTestDataLines
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data,bool withGS,bool indiced)

{
  undefined7 in_register_00000009;
  char *pcVar1;
  undefined3 in_register_00000011;
  
  pcVar1 = (char *)0x0;
  if (CONCAT31(in_register_00000011,withGS) != 0) {
    pcVar1 = 
    "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nprecision highp float;\n\nlayout(lines_adjacency)            in;\nlayout(line_strip, max_vertices=2) out;\n\nlayout(location = 0) out vec4 out_adjacent_geometry;\nlayout(location = 1) out vec4 out_geometry;\n\nvoid main()\n{\n    out_adjacent_geometry = gl_in[0].gl_Position;\n    out_geometry          = gl_in[1].gl_Position;\n    EmitVertex();\n    out_adjacent_geometry = gl_in[3].gl_Position;\n    out_geometry          = gl_in[2].gl_Position;\n    EmitVertex();\n    EndPrimitive();\n}\n"
    ;
  }
  test_data->m_gs_code = pcVar1;
  test_data->m_mode = 10;
  test_data->m_tf_mode = 1;
  createGrid(this,test_data);
  if ((int)CONCAT71(in_register_00000009,indiced) != 0) {
    setLinePointsindiced(this,test_data);
    return;
  }
  setLinePointsNonindiced(this,test_data);
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::configureTestDataLines(AdjacencyTestData& test_data, bool withGS, bool indiced)
{
	static const char* gsCode = "${VERSION}\n"
								"\n"
								"${GEOMETRY_SHADER_REQUIRE}\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"layout(lines_adjacency)            in;\n"
								"layout(line_strip, max_vertices=2) out;\n"
								"\n"
								"layout(location = 0) out vec4 out_adjacent_geometry;\n"
								"layout(location = 1) out vec4 out_geometry;\n"
								"\n"
								"void main()\n"
								"{\n"
								"    out_adjacent_geometry = gl_in[0].gl_Position;\n"
								"    out_geometry          = gl_in[1].gl_Position;\n"
								"    EmitVertex();\n"
								"    out_adjacent_geometry = gl_in[3].gl_Position;\n"
								"    out_geometry          = gl_in[2].gl_Position;\n"
								"    EmitVertex();\n"
								"    EndPrimitive();\n"
								"}\n";

	test_data.m_gs_code = (withGS) ? gsCode : 0;
	test_data.m_mode	= GL_LINES_ADJACENCY_EXT;
	test_data.m_tf_mode = GL_LINES;

	createGrid(test_data);

	if (indiced)
	{
		setLinePointsindiced(test_data);
	}
	else
	{
		setLinePointsNonindiced(test_data);
	}
}